

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_sameName(ENCODING *enc,char *ptr1,char *ptr2)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  
  do {
    bVar1 = *ptr1;
    if (bVar1 - 0xd8 < 4) {
LAB_003164da:
      if (bVar1 != *ptr2) {
        return 0;
      }
      ptr2 = (char *)((byte *)ptr2 + 1);
      bVar3 = ((byte *)ptr1)[1];
      ptr1 = (char *)((byte *)ptr1 + 1);
LAB_003164ed:
      if (bVar3 != *ptr2) {
        return 0;
      }
      ptr2 = (char *)((byte *)ptr2 + 1);
      bVar3 = ((byte *)ptr1)[1];
      ptr1 = (char *)((byte *)ptr1 + 1);
LAB_00316500:
      if (bVar3 != *ptr2) {
        return 0;
      }
      if (((byte *)ptr1)[1] != ((byte *)ptr2)[1]) {
        return 0;
      }
    }
    else {
      if (bVar1 == 0) {
        uVar2 = (uint)*(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr1)[1]);
        bVar3 = 0;
        if (uVar2 < 0x1e) {
          if ((0x2f400000U >> (uVar2 & 0x1f) & 1) != 0) goto LAB_00316552;
          if (uVar2 == 6) goto LAB_003164ed;
          if (uVar2 == 7) goto LAB_003164da;
        }
        if (uVar2 != 5) {
LAB_0031658b:
          bVar1 = *ptr2;
          if (3 < bVar1 - 0xdc) {
            if (bVar1 == 0) {
              uVar2 = (uint)*(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr2)[1]);
              if ((uVar2 < 0x1e) && ((0x2f4000e0U >> (uVar2 & 0x1f) & 1) != 0)) {
                return 0;
              }
            }
            else {
              if (bVar1 != 0xff) {
                return 0;
              }
              if (((byte *)ptr2)[1] < 0xfe) {
                return 0;
              }
            }
          }
          return 1;
        }
        goto LAB_00316500;
      }
      if (bVar1 == 0xff) {
        if (0xfd < ((byte *)ptr1)[1]) goto LAB_0031658b;
      }
      else if (bVar1 - 0xdc < 4) goto LAB_0031658b;
LAB_00316552:
      if (*ptr2 != bVar1) {
        return 0;
      }
      if (((byte *)ptr2)[1] != ((byte *)ptr1)[1]) {
        return 0;
      }
    }
    ptr2 = (char *)((byte *)ptr2 + 2);
    ptr1 = (char *)((byte *)ptr1 + 2);
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(sameName)(const ENCODING *enc, const char *ptr1, const char *ptr2)
{
  for (;;) {
    switch (BYTE_TYPE(enc, ptr1)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (*ptr1++ != *ptr2++) \
        return 0;
    LEAD_CASE(4) LEAD_CASE(3) LEAD_CASE(2)
#undef LEAD_CASE
      /* fall through */
      if (*ptr1++ != *ptr2++)
        return 0;
      break;
    case BT_NONASCII:
    case BT_NMSTRT:
#ifdef XML_NS
    case BT_COLON:
#endif
    case BT_HEX:
    case BT_DIGIT:
    case BT_NAME:
    case BT_MINUS:
      if (*ptr2++ != *ptr1++)
        return 0;
      if (MINBPC(enc) > 1) {
        if (*ptr2++ != *ptr1++)
          return 0;
        if (MINBPC(enc) > 2) {
          if (*ptr2++ != *ptr1++)
            return 0;
          if (MINBPC(enc) > 3) {
            if (*ptr2++ != *ptr1++)
              return 0;
          }
        }
      }
      break;
    default:
      if (MINBPC(enc) == 1 && *ptr1 == *ptr2)
        return 1;
      switch (BYTE_TYPE(enc, ptr2)) {
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
      case BT_NONASCII:
      case BT_NMSTRT:
#ifdef XML_NS
      case BT_COLON:
#endif
      case BT_HEX:
      case BT_DIGIT:
      case BT_NAME:
      case BT_MINUS:
        return 0;
      default:
        return 1;
      }
    }
  }
  /* not reached */
}